

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O3

UDisplayContext __thiscall
icu_63::DateFormat::getContext(DateFormat *this,UDisplayContextType type,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return UDISPCTX_STANDARD_NAMES;
  }
  if (type == UDISPCTX_TYPE_CAPITALIZATION) {
    return this->fCapitalizationContext;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return UDISPCTX_STANDARD_NAMES;
}

Assistant:

UDisplayContext DateFormat::getContext(UDisplayContextType type, UErrorCode& status) const
{
    if (U_FAILURE(status))
        return (UDisplayContext)0;
    if (type != UDISPCTX_TYPE_CAPITALIZATION) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return (UDisplayContext)0;
    }
    return fCapitalizationContext;
}